

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O1

SnapShot * TTD::SnapShot::ParseSnapshotFromFile(FileReader *reader)

{
  uint32 uVar1;
  int iVar2;
  HeapAllocator *this;
  SnapShot *this_00;
  SnapContext *intoCtx;
  int *piVar3;
  TTD_LOG_PTR_ID TVar4;
  SnapHandler *pSVar5;
  SnapType *pSVar6;
  FunctionBodyResolveInfo *fbInfo;
  SnapPrimitiveValue *snapValue;
  SnapObject *snpObject;
  ScriptFunctionScopeInfo *funcScopeInfo;
  SlotArrayInfo *slotInfo;
  UnorderedArrayListLink *pUVar7;
  UnorderedArrayListLink *pUVar8;
  SnapHandler *pSVar9;
  SnapType *pSVar10;
  uint32 uVar11;
  SnapType *local_88;
  undefined1 local_80 [8];
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> handlerMap;
  undefined1 local_50 [8];
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> typeMap;
  
  (*reader->_vptr_FileReader[6])(reader,0);
  FileReader::ReadDouble(reader,timeTotal,false);
  FileReader::ReadUInt64(reader,usedMemory,true);
  FileReader::ReadUInt64(reader,reservedMemory,true);
  FileReader::ReadDouble(reader,timeGC,true);
  FileReader::ReadDouble(reader,timeMark,true);
  FileReader::ReadDouble(reader,timeExtract,true);
  local_80 = (undefined1  [8])&typeinfo;
  handlerMap.m_h1Prime = 0;
  handlerMap.m_h2Prime = 0;
  handlerMap.m_capacity = 0xffffffff;
  handlerMap._12_4_ = 0xffffffff;
  handlerMap.m_hashArray = (Entry *)anon_var_dwarf_430a7b6;
  handlerMap.m_count = 0x71;
  this = Memory::HeapAllocator::TrackAllocInfo
                   (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_80);
  this_00 = (SnapShot *)Memory::HeapAllocator::AllocT<true>(this,0x1f8);
  SnapShot(this_00,0.0);
  if (this_00 != (SnapShot *)0x0) {
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        intoCtx = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::NextOpenEntry
                            (&this_00->m_ctxList);
        NSSnapValues::ParseSnapContext(intoCtx,uVar11 != 0,reader,(SlabAllocator *)this_00);
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        piVar3 = UnorderedArrayList<int,_32UL>::NextOpenEntry
                           (&this_00->m_tcSymbolRegistrationMapContents);
        iVar2 = (*reader->_vptr_FileReader[0xc])(reader,(ulong)(uVar11 != 0));
        *piVar3 = iVar2;
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    TVar4 = FileReader::ReadLogTag(reader,ctxTag,true);
    this_00->m_activeScriptContext = TVar4;
    ParseListHelper<void(*)(TTD::NSSnapValues::SnapRootInfoEntry*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapValues::SnapRootInfoEntry,512ul>
              (SnapRootPinEntryParse,&this_00->m_rootList,reader,(SlabAllocator *)this_00);
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        pSVar5 = UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::NextOpenEntry
                           (&this_00->m_handlerList);
        NSSnapType::ParseSnapHandler(pSVar5,uVar11 != 0,reader,(SlabAllocator *)this_00);
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    local_80 = (undefined1  [8])0x0;
    handlerMap._0_8_ = handlerMap._0_8_ & 0xffffffff00000000;
    handlerMap.m_capacity = 0;
    handlerMap._12_4_ = 0;
    handlerMap.m_hashArray = (Entry *)((ulong)handlerMap.m_hashArray & 0xffffffff00000000);
    uVar1 = UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::Count(&this_00->m_handlerList)
    ;
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::Initialize
              ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)local_80,
               uVar1);
    pSVar9 = (this_00->m_handlerList).m_inlineHeadBlock.CurrPos;
    pSVar5 = (this_00->m_handlerList).m_inlineHeadBlock.BlockData;
    if (pSVar5 != (SnapHandler *)0x0 && pSVar5 != pSVar9) {
      pUVar7 = (this_00->m_handlerList).m_inlineHeadBlock.Next;
      do {
        local_50 = (undefined1  [8])pSVar5;
        TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::AddItem
                  ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)
                   local_80,pSVar5->HandlerId,(SnapHandler **)local_50);
        pSVar5 = pSVar5 + 1;
        if (pSVar5 == pSVar9) {
          if (pUVar7 == (UnorderedArrayListLink *)0x0) {
            pSVar5 = (SnapHandler *)0x0;
          }
          else {
            pSVar9 = pUVar7->CurrPos;
            pSVar5 = pUVar7->BlockData;
            pUVar7 = pUVar7->Next;
          }
        }
      } while (pSVar5 != (SnapHandler *)0x0);
    }
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        pSVar6 = UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::NextOpenEntry
                           (&this_00->m_typeList);
        NSSnapType::ParseSnapType
                  (pSVar6,uVar11 != 0,reader,(SlabAllocator *)this_00,
                   (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)
                   local_80);
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    local_50 = (undefined1  [8])0x0;
    typeMap.m_h1Prime = 0;
    typeMap.m_capacity = 0;
    typeMap._12_4_ = 0;
    typeMap.m_hashArray._0_4_ = 0;
    uVar1 = UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::Count(&this_00->m_typeList);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::Initialize
              ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)local_50,uVar1
              );
    pSVar10 = (this_00->m_typeList).m_inlineHeadBlock.CurrPos;
    pSVar6 = (this_00->m_typeList).m_inlineHeadBlock.BlockData;
    if (pSVar6 != (SnapType *)0x0 && pSVar6 != pSVar10) {
      pUVar8 = (this_00->m_typeList).m_inlineHeadBlock.Next;
      do {
        local_88 = pSVar6;
        TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::AddItem
                  ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)local_50,
                   pSVar6->TypePtrId,&local_88);
        pSVar6 = pSVar6 + 1;
        if (pSVar6 == pSVar10) {
          if (pUVar8 == (UnorderedArrayListLink *)0x0) {
            pSVar6 = (SnapType *)0x0;
          }
          else {
            pSVar10 = pUVar8->CurrPos;
            pSVar6 = pUVar8->BlockData;
            pUVar8 = pUVar8->Next;
          }
        }
      } while (pSVar6 != (SnapType *)0x0);
    }
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        fbInfo = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::
                 NextOpenEntry(&this_00->m_functionBodyList);
        NSSnapValues::ParseFunctionBodyInfo(fbInfo,uVar11 != 0,reader,(SlabAllocator *)this_00);
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        snapValue = UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::NextOpenEntry
                              (&this_00->m_primitiveObjectList);
        NSSnapValues::ParseSnapPrimitiveValue
                  (snapValue,uVar11 != 0,reader,(SlabAllocator *)this_00,
                   (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)local_50);
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        snpObject = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::NextOpenEntry
                              (&this_00->m_compoundObjectList);
        NSSnapObjects::ParseObject
                  (snpObject,uVar11 != 0,reader,(SlabAllocator *)this_00,
                   this_00->m_snapObjectVTableArray,
                   (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)local_50);
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        funcScopeInfo =
             UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::NextOpenEntry
                       (&this_00->m_scopeEntries);
        NSSnapValues::ParseScriptFunctionScopeInfo
                  (funcScopeInfo,uVar11 != 0,reader,(SlabAllocator *)this_00);
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    uVar1 = FileReader::ReadLengthValue(reader,true);
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        slotInfo = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::NextOpenEntry
                             (&this_00->m_slotArrayEntries);
        NSSnapValues::ParseSlotArrayInfo(slotInfo,uVar11 != 0,reader,(SlabAllocator *)this_00);
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    (*reader->_vptr_FileReader[5])(reader);
    FileReader::ReadDouble(reader,timeWrite,true);
    (*reader->_vptr_FileReader[7])(reader);
    if (typeMap._8_8_ != 0) {
      Memory::
      DeleteArray<Memory::HeapAllocator,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapType*>::Entry>
                (&Memory::HeapAllocator::Instance,(ulong)typeMap.m_h1Prime,(Entry *)typeMap._8_8_);
      typeMap.m_capacity = 0;
      typeMap._12_4_ = 0;
      typeMap.m_h1Prime = 0;
      typeMap.m_hashArray._0_4_ = 0;
      local_50 = (undefined1  [8])0x0;
    }
    if (handlerMap._8_8_ != 0) {
      Memory::
      DeleteArray<Memory::HeapAllocator,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapHandler*>::Entry>
                (&Memory::HeapAllocator::Instance,handlerMap._0_8_ & 0xffffffff,
                 (Entry *)handlerMap._8_8_);
    }
    return this_00;
  }
  TTDAbort_unrecoverable_error("OOM in TTD");
}

Assistant:

SnapShot* SnapShot::ParseSnapshotFromFile(FileReader* reader)
    {
        reader->ReadRecordStart();

        reader->ReadDouble(NSTokens::Key::timeTotal);
        reader->ReadUInt64(NSTokens::Key::usedMemory, true);
        reader->ReadUInt64(NSTokens::Key::reservedMemory, true);
        reader->ReadDouble(NSTokens::Key::timeGC, true);
        reader->ReadDouble(NSTokens::Key::timeMark, true);
        reader->ReadDouble(NSTokens::Key::timeExtract, true);

        SnapShot* snap = TT_HEAP_NEW(SnapShot, 0.0);

        uint32 ctxCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < ctxCount; ++i)
        {
            NSSnapValues::SnapContext* snpCtx = snap->m_ctxList.NextOpenEntry();
            NSSnapValues::ParseSnapContext(snpCtx, i != 0, reader, snap->GetSnapshotSlabAllocator());
        }
        reader->ReadSequenceEnd();

        uint32 tcSymbolCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < tcSymbolCount; ++i)
        {
            Js::PropertyId* symid = snap->m_tcSymbolRegistrationMapContents.NextOpenEntry();
            *symid = reader->ReadNakedUInt32(i != 0);
        }
        reader->ReadSequenceEnd();

        snap->m_activeScriptContext = reader->ReadLogTag(NSTokens::Key::ctxTag, true);
        SnapShot::ParseListHelper(&SnapShot::SnapRootPinEntryParse, snap->m_rootList, reader, snap->GetSnapshotSlabAllocator());

        ////

        SnapShot::ParseListHelper(&NSSnapType::ParseSnapHandler, snap->m_handlerList, reader, snap->GetSnapshotSlabAllocator());

        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapHandler*> handlerMap;
        handlerMap.Initialize(snap->m_handlerList.Count());
        for(auto iter = snap->m_handlerList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            handlerMap.AddItem(iter.Current()->HandlerId, iter.Current());
        }

        SnapShot::ParseListHelper_WMap(&NSSnapType::ParseSnapType, snap->m_typeList, reader, snap->GetSnapshotSlabAllocator(), handlerMap);
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*> typeMap;
        typeMap.Initialize(snap->m_typeList.Count());

        for(auto iter = snap->m_typeList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            typeMap.AddItem(iter.Current()->TypePtrId, iter.Current());
        }

        ////
        uint32 bodyCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < bodyCount; ++i)
        {
            NSSnapValues::FunctionBodyResolveInfo* into = snap->m_functionBodyList.NextOpenEntry();
            NSSnapValues::ParseFunctionBodyInfo(into, i != 0, reader, snap->GetSnapshotSlabAllocator());
        }
        reader->ReadSequenceEnd();

        SnapShot::ParseListHelper_WMap(&NSSnapValues::ParseSnapPrimitiveValue, snap->m_primitiveObjectList, reader, snap->GetSnapshotSlabAllocator(), typeMap);

        uint32 objCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < objCount; ++i)
        {
            NSSnapObjects::SnapObject* into = snap->m_compoundObjectList.NextOpenEntry();
            NSSnapObjects::ParseObject(into, i != 0, reader, snap->GetSnapshotSlabAllocator(), snap->m_snapObjectVTableArray, typeMap);
        }
        reader->ReadSequenceEnd();

        ////
        SnapShot::ParseListHelper(&NSSnapValues::ParseScriptFunctionScopeInfo, snap->m_scopeEntries, reader, snap->GetSnapshotSlabAllocator());
        SnapShot::ParseListHelper(&NSSnapValues::ParseSlotArrayInfo, snap->m_slotArrayEntries, reader, snap->GetSnapshotSlabAllocator());

        reader->ReadDouble(NSTokens::Key::timeWrite, true);

        reader->ReadRecordEnd();

        return snap;
    }